

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plg.cpp
# Opt level: O2

bool __thiscall rw::PluginList::streamRead(PluginList *this,Stream *stream,void *object)

{
  LLLink *pLVar1;
  bool bVar2;
  LLLink *pLVar3;
  bool bVar4;
  LinkList *pLVar5;
  int32 length;
  ChunkHeaderInfo header;
  
  bVar4 = false;
  bVar2 = findChunk(stream,3,(uint32 *)&length,(uint32 *)0x0);
  if (bVar2) {
    pLVar5 = &this->plugins;
    for (; 0 < length; length = length - header.length) {
      bVar2 = readChunkHeaderInfo(stream,&header);
      if (!bVar2) {
        return false;
      }
      length = length + -0xc;
      pLVar1 = (pLVar5->link).next;
      do {
        pLVar3 = pLVar1;
        if (pLVar3 == &pLVar5->link) {
          (*stream->_vptr_Stream[5])(stream,(ulong)header.length,1);
          goto LAB_0010c0fb;
        }
        pLVar1 = pLVar3->next;
      } while ((*(uint32 *)&pLVar3[-5].next != header.type) || (pLVar3[-3].next == (LLLink *)0x0));
      (*(code *)pLVar3[-3].next)
                (stream,header.length,object,*(undefined4 *)&pLVar3[-6].prev,
                 *(undefined4 *)((long)&pLVar3[-6].prev + 4));
LAB_0010c0fb:
    }
    pLVar1 = (pLVar5->link).next;
    while (pLVar3 = pLVar1, pLVar3 != &pLVar5->link) {
      pLVar1 = pLVar3->next;
      if (pLVar3[-1].next != (LLLink *)0x0) {
        (*(code *)pLVar3[-1].next)
                  (object,*(undefined4 *)&pLVar3[-6].prev,
                   *(undefined4 *)((long)&pLVar3[-6].prev + 4));
      }
    }
    bVar4 = true;
  }
  return bVar4;
}

Assistant:

bool
PluginList::streamRead(Stream *stream, void *object)
{
	int32 length;
	ChunkHeaderInfo header;
	if(!findChunk(stream, ID_EXTENSION, (uint32*)&length, nil))
		return false;
	while(length > 0){
		if(!readChunkHeaderInfo(stream, &header))
			return false;
		length -= 12;
		FORLIST(lnk, this->plugins){
			Plugin *p = PLG(lnk);
			if(p->id == header.type && p->read){
				p->read(stream, header.length,
				        object, p->offset, p->size);
				goto cont;
			}
		}
		stream->seek(header.length);
cont:
		length -= header.length;
	}

	// now the always callbacks
	FORLIST(lnk, this->plugins){
		Plugin *p = PLG(lnk);
		if(p->alwaysCallback)
			p->alwaysCallback(object, p->offset, p->size);
	}
	return true;
}